

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMan.c
# Opt level: O2

void Mpm_ManPrintStats(Mpm_Man_t *p)

{
  abctime aVar1;
  long lVar2;
  int iVar3;
  double dVar4;
  double dVar5;
  
  Mmr_StepMemory(p->pManCuts);
  iVar3 = 0x7f28d4;
  printf("Memory usage:  Mig = %.2f MB  Map = %.2f MB  Cut = %.2f MB    Total = %.2f MB.  ");
  if (p->timeDerive != 0) {
    iVar3 = 10;
    putchar(10);
    aVar1 = Abc_Clock();
    lVar2 = aVar1 - p->timeTotal;
    p->timeTotal = lVar2;
    p->timeOther = lVar2 - p->timeDerive;
    Abc_Print(iVar3,"Runtime breakdown:\n");
    Abc_Print(iVar3,"%s =","Complete cut computation   ");
    dVar4 = 0.0;
    if (p->timeTotal != 0) {
      dVar4 = ((double)p->timeDerive * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeDerive / 1000000.0,dVar4);
    Abc_Print(iVar3,"%s =","- Merging cuts             ");
    dVar4 = 0.0;
    if (p->timeTotal != 0) {
      dVar4 = ((double)p->timeMerge * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeMerge / 1000000.0,dVar4);
    Abc_Print(iVar3,"%s =","- Evaluting cut parameters ");
    dVar4 = 0.0;
    if (p->timeTotal != 0) {
      dVar4 = ((double)p->timeEval * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeEval / 1000000.0,dVar4);
    Abc_Print(iVar3,"%s =","- Checking cut containment ");
    dVar4 = 0.0;
    if (p->timeTotal != 0) {
      dVar4 = ((double)p->timeCompare * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeCompare / 1000000.0,dVar4);
    Abc_Print(iVar3,"%s =","- Adding cuts to storage   ");
    dVar4 = 0.0;
    if (p->timeTotal != 0) {
      dVar4 = ((double)p->timeStore * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeStore / 1000000.0,dVar4);
    Abc_Print(iVar3,"%s =","Other                      ");
    dVar4 = 0.0;
    if (p->timeTotal != 0) {
      dVar4 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar4);
    Abc_Print(iVar3,"%s =","TOTAL                      ");
    dVar4 = (double)p->timeTotal;
    dVar5 = 0.0;
    if (p->timeTotal != 0) {
      dVar5 = (dVar4 * 100.0) / dVar4;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",dVar4 / 1000000.0,dVar5);
    return;
  }
  aVar1 = Abc_Clock();
  lVar2 = p->timeTotal;
  Abc_Print(iVar3,"%s =","Time");
  Abc_Print(iVar3,"%9.2f sec\n",(double)(aVar1 - lVar2) / 1000000.0);
  return;
}

Assistant:

void Mpm_ManPrintStats( Mpm_Man_t * p )
{
    printf( "Memory usage:  Mig = %.2f MB  Map = %.2f MB  Cut = %.2f MB    Total = %.2f MB.  ", 
        1.0 * Mig_ManObjNum(p->pMig) * sizeof(Mig_Obj_t) / (1 << 20), 
        1.0 * Mig_ManObjNum(p->pMig) * 48 / (1 << 20), 
        1.0 * Mmr_StepMemory(p->pManCuts) / (1 << 17), 
        1.0 * Mig_ManObjNum(p->pMig) * sizeof(Mig_Obj_t) / (1 << 20) + 
        1.0 * Mig_ManObjNum(p->pMig) * 48 / (1 << 20) +
        1.0 * Mmr_StepMemory(p->pManCuts) / (1 << 17) );
    if ( p->timeDerive )
    {
        printf( "\n" );
        p->timeTotal = Abc_Clock() - p->timeTotal;
        p->timeOther = p->timeTotal - p->timeDerive;

        Abc_Print( 1, "Runtime breakdown:\n" );
        ABC_PRTP( "Complete cut computation   ", p->timeDerive , p->timeTotal );
        ABC_PRTP( "- Merging cuts             ", p->timeMerge  , p->timeTotal );
        ABC_PRTP( "- Evaluting cut parameters ", p->timeEval   , p->timeTotal );
        ABC_PRTP( "- Checking cut containment ", p->timeCompare, p->timeTotal );
        ABC_PRTP( "- Adding cuts to storage   ", p->timeStore  , p->timeTotal );
        ABC_PRTP( "Other                      ", p->timeOther  , p->timeTotal );
        ABC_PRTP( "TOTAL                      ", p->timeTotal  , p->timeTotal );
    }
    else
        Abc_PrintTime( 1, "Time", Abc_Clock() - p->timeTotal );
}